

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O0

int lws_tls_openssl_cert_info
              (X509 *x509,lws_tls_cert_info type,lws_tls_cert_info_results *buf,size_t len)

{
  undefined4 uVar1;
  int iVar2;
  ASN1_TIME *pAVar3;
  time_t tVar4;
  void *__dest;
  char *__src;
  size_t sVar5;
  X509_PUBKEY *pXVar6;
  int iVar7;
  uint8_t *local_58;
  uint8_t *ptmp;
  uint8_t *tmp;
  size_t klen;
  char *p;
  X509_NAME *xn;
  size_t len_local;
  lws_tls_cert_info_results *buf_local;
  X509 *pXStack_18;
  lws_tls_cert_info type_local;
  X509 *x509_local;
  
  if (x509 == (X509 *)0x0) {
    return -1;
  }
  xn = (X509_NAME *)len;
  len_local = (size_t)buf;
  buf_local._4_4_ = type;
  pXStack_18 = x509;
  switch(type) {
  case LWS_TLS_CERT_INFO_VALIDITY_FROM:
    pAVar3 = (ASN1_TIME *)X509_getm_notBefore(x509);
    tVar4 = lws_tls_openssl_asn1time_to_unix(pAVar3);
    *(time_t *)len_local = tVar4;
    if (*(long *)len_local == -1) {
      return -1;
    }
    goto LAB_00139f19;
  case LWS_TLS_CERT_INFO_VALIDITY_TO:
    pAVar3 = (ASN1_TIME *)X509_getm_notAfter(x509);
    tVar4 = lws_tls_openssl_asn1time_to_unix(pAVar3);
    *(time_t *)len_local = tVar4;
    if (*(long *)len_local == -1) {
      return -1;
    }
    goto LAB_00139f19;
  case LWS_TLS_CERT_INFO_COMMON_NAME:
    p = (char *)X509_get_subject_name((X509 *)x509);
    if ((X509_NAME *)p == (X509_NAME *)0x0) {
      x509_local._4_4_ = -1;
    }
    else {
      X509_NAME_oneline((X509_NAME *)p,(char *)(len_local + 4),(int)xn + -2);
      klen = (size_t)strstr((char *)(len_local + 4),"/CN=");
      if ((char *)klen != (char *)0x0) {
        __dest = (void *)(len_local + 4);
        __src = (char *)(klen + 4);
        sVar5 = strlen((char *)(klen + 4));
        memmove(__dest,__src,sVar5 + 1);
      }
      sVar5 = strlen((char *)(len_local + 4));
      *(int *)len_local = (int)sVar5;
      x509_local._4_4_ = 0;
    }
    break;
  case LWS_TLS_CERT_INFO_ISSUER_NAME:
    p = (char *)X509_get_issuer_name((X509 *)x509);
    if ((X509_NAME *)p == (X509_NAME *)0x0) {
      x509_local._4_4_ = -1;
    }
    else {
      X509_NAME_oneline((X509_NAME *)p,(char *)(len_local + 4),(int)xn + -1);
      sVar5 = strlen((char *)(len_local + 4));
      *(int *)len_local = (int)sVar5;
      x509_local._4_4_ = 0;
    }
    break;
  case LWS_TLS_CERT_INFO_USAGE:
    uVar1 = X509_get_key_usage(x509);
    *(undefined4 *)len_local = uVar1;
LAB_00139f19:
    x509_local._4_4_ = 0;
    break;
  default:
    x509_local._4_4_ = -1;
    break;
  case LWS_TLS_CERT_INFO_OPAQUE_PUBLIC_KEY:
    pXVar6 = (X509_PUBKEY *)X509_get_X509_PUBKEY(x509);
    iVar2 = i2d_X509_PUBKEY(pXVar6,(uchar **)0x0);
    tmp = (uint8_t *)(long)iVar2;
    if (((X509_NAME *)tmp == (X509_NAME *)0x0) || (xn < tmp)) {
      x509_local._4_4_ = -1;
    }
    else {
      local_58 = (uint8_t *)
                 CRYPTO_malloc(iVar2,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/tls/openssl/openssl-x509.c"
                               ,0x90);
      if (local_58 == (uint8_t *)0x0) {
        x509_local._4_4_ = -1;
      }
      else {
        ptmp = local_58;
        pXVar6 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXStack_18);
        iVar2 = i2d_X509_PUBKEY(pXVar6,&local_58);
        iVar7 = (int)tmp;
        if (((iVar2 == iVar7) && (local_58 != (uint8_t *)0x0)) &&
           ((int)local_58 - (int)ptmp == iVar7)) {
          *(int *)len_local = iVar7;
          memcpy((void *)(len_local + 4),ptmp,(size_t)tmp);
          CRYPTO_free(ptmp);
          x509_local._4_4_ = 0;
        }
        else {
          _lws_log(8,"%s: cert public key extraction failed\n","lws_tls_openssl_cert_info");
          if (local_58 != (uint8_t *)0x0) {
            CRYPTO_free(ptmp);
          }
          x509_local._4_4_ = -1;
        }
      }
    }
  }
  return x509_local._4_4_;
}

Assistant:

int
lws_tls_openssl_cert_info(X509 *x509, enum lws_tls_cert_info type,
			  union lws_tls_cert_info_results *buf, size_t len)
{
	X509_NAME *xn;
#if !defined(LWS_PLAT_OPTEE)
	char *p;
#endif

	if (!x509)
		return -1;

#if OPENSSL_VERSION_NUMBER >= 0x10100000L && !defined(X509_get_notBefore)
#define X509_get_notBefore(x)	X509_getm_notBefore(x)
#define X509_get_notAfter(x)	X509_getm_notAfter(x)
#endif

	switch (type) {
	case LWS_TLS_CERT_INFO_VALIDITY_FROM:
		buf->time = lws_tls_openssl_asn1time_to_unix(
					X509_get_notBefore(x509));
		if (buf->time == (time_t)-1)
			return -1;
		break;

	case LWS_TLS_CERT_INFO_VALIDITY_TO:
		buf->time = lws_tls_openssl_asn1time_to_unix(
					X509_get_notAfter(x509));
		if (buf->time == (time_t)-1)
			return -1;
		break;

	case LWS_TLS_CERT_INFO_COMMON_NAME:
#if defined(LWS_PLAT_OPTEE)
		return -1;
#else
		xn = X509_get_subject_name(x509);
		if (!xn)
			return -1;
		X509_NAME_oneline(xn, buf->ns.name, (int)len - 2);
		p = strstr(buf->ns.name, "/CN=");
		if (p)
			memmove(buf->ns.name, p + 4, strlen(p + 4) + 1);
		buf->ns.len = (int)strlen(buf->ns.name);
		return 0;
#endif
	case LWS_TLS_CERT_INFO_ISSUER_NAME:
		xn = X509_get_issuer_name(x509);
		if (!xn)
			return -1;
		X509_NAME_oneline(xn, buf->ns.name, (int)len - 1);
		buf->ns.len = (int)strlen(buf->ns.name);
		return 0;

	case LWS_TLS_CERT_INFO_USAGE:
#if defined(LWS_HAVE_X509_get_key_usage)
		buf->usage = X509_get_key_usage(x509);
		break;
#else
		return -1;
#endif

	case LWS_TLS_CERT_INFO_OPAQUE_PUBLIC_KEY:
	{
#ifndef USE_WOLFSSL
		size_t klen = i2d_X509_PUBKEY(X509_get_X509_PUBKEY(x509), NULL);
		uint8_t *tmp, *ptmp;

		if (!klen || klen > len)
			return -1;

		tmp = (uint8_t *)OPENSSL_malloc(klen);
		if (!tmp)
			return -1;

		ptmp = tmp;
		if (i2d_X509_PUBKEY(
			      X509_get_X509_PUBKEY(x509), &ptmp) != (int)klen ||
		    !ptmp || lws_ptr_diff(ptmp, tmp) != (int)klen) {
			lwsl_info("%s: cert public key extraction failed\n",
				  __func__);
			if (ptmp)
				OPENSSL_free(tmp);

			return -1;
		}

		buf->ns.len = (int)klen;
		memcpy(buf->ns.name, tmp, klen);
		OPENSSL_free(tmp);
#endif
		return 0;
	}
	default:
		return -1;
	}

	return 0;
}